

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

int IFN_Previous_Character(FORM *form)

{
  int iVar1;
  FORM *form_local;
  
  iVar1 = form->curcol + -1;
  form->curcol = iVar1;
  if (iVar1 < 0) {
    iVar1 = form->currow + -1;
    form->currow = iVar1;
    if (iVar1 < 0) {
      form->currow = form->currow + 1;
      form->curcol = form->curcol + 1;
      return -0xc;
    }
    form->curcol = form->current->dcols + -1;
  }
  return 0;
}

Assistant:

static int IFN_Previous_Character(FORM * form)
{
  if ((--(form->curcol))<0)
    {
      if ((--(form->currow))<0)
        {
          form->currow++;
          form->curcol++;
          return(E_REQUEST_DENIED);
        }
      form->curcol = form->current->dcols - 1;
    }
  return(E_OK);
}